

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationFractionalSpacingTests.cpp
# Opt level: O3

TestCaseGroup * vkt::tessellation::createFractionalSpacingTests(TestContext *testCtx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestNode *this;
  TestNode *pTVar3;
  string local_60;
  string local_40;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"fractional_spacing","Test fractional spacing modes");
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"odd","");
  paVar2 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  pTVar3 = (TestNode *)
           createFunctionCaseWithPrograms<vkt::tessellation::SpacingMode>
                     (this->m_testCtx,NODETYPE_SELF_VALIDATE,&local_40,&local_60,
                      anon_unknown_0::initPrograms,anon_unknown_0::test,SPACINGMODE_FRACTIONAL_ODD);
  tcu::TestNode::addChild(this,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"even","");
  local_60._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  pTVar3 = (TestNode *)
           createFunctionCaseWithPrograms<vkt::tessellation::SpacingMode>
                     (this->m_testCtx,NODETYPE_SELF_VALIDATE,&local_40,&local_60,
                      anon_unknown_0::initPrograms,anon_unknown_0::test,SPACINGMODE_FRACTIONAL_EVEN)
  ;
  tcu::TestNode::addChild(this,pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createFractionalSpacingTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "fractional_spacing", "Test fractional spacing modes"));

	addFunctionCaseWithPrograms(group.get(), "odd",  "", initPrograms, test, SPACINGMODE_FRACTIONAL_ODD);
	addFunctionCaseWithPrograms(group.get(), "even", "", initPrograms, test, SPACINGMODE_FRACTIONAL_EVEN);

	return group.release();
}